

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

Aig_Man_t * Saig_ManCreateMiter(Aig_Man_t *p0,Aig_Man_t *p1,int Oper)

{
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar1;
  void *pvVar2;
  uint uVar3;
  Aig_Man_t *p;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  Aig_Obj_t *pAVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  
  if ((p0->nRegs < 1) && (p1->nRegs < 1)) {
    __assert_fail("Saig_ManRegNum(p0) > 0 || Saig_ManRegNum(p1) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x69,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p0->nTruePis != p1->nTruePis) {
    __assert_fail("Saig_ManPiNum(p0) == Saig_ManPiNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x6a,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p0->nTruePos != p1->nTruePos) {
    __assert_fail("Saig_ManPoNum(p0) == Saig_ManPoNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x6b,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  p = Aig_ManStart(p1->vObjs->nSize + p0->vObjs->nSize);
  pcVar4 = (char *)malloc(6);
  builtin_strncpy(pcVar4,"miter",6);
  p->pName = pcVar4;
  Aig_ManCleanData(p0);
  Aig_ManCleanData(p1);
  aVar1 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  p0->pConst1->field_5 = aVar1;
  p1->pConst1->field_5 = aVar1;
  if (0 < p0->nTruePis) {
    lVar12 = 0;
    do {
      if (p0->vCis->nSize <= lVar12) goto LAB_006ea369;
      pvVar2 = p0->vCis->pArray[lVar12];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 < p0->nTruePis);
  }
  if (0 < p1->nTruePis) {
    lVar12 = 0;
    do {
      if ((p1->vCis->nSize <= lVar12) || (p->vCis->nSize <= lVar12)) goto LAB_006ea369;
      *(void **)((long)p1->vCis->pArray[lVar12] + 0x28) = p->vCis->pArray[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 < p1->nTruePis);
  }
  if (0 < p0->nRegs) {
    iVar10 = 0;
    do {
      uVar3 = p0->nTruePis + iVar10;
      if (((int)uVar3 < 0) || (p0->vCis->nSize <= (int)uVar3)) goto LAB_006ea369;
      pvVar2 = p0->vCis->pArray[uVar3];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
      iVar10 = iVar10 + 1;
    } while (iVar10 < p0->nRegs);
  }
  if (0 < p1->nRegs) {
    iVar10 = 0;
    do {
      uVar3 = p1->nTruePis + iVar10;
      if (((int)uVar3 < 0) || (p1->vCis->nSize <= (int)uVar3)) goto LAB_006ea369;
      pvVar2 = p1->vCis->pArray[uVar3];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
      iVar10 = iVar10 + 1;
    } while (iVar10 < p1->nRegs);
  }
  pVVar7 = p0->vObjs;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar12];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006ea388;
        uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar5 = Aig_And(p,pAVar5,pAVar9);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
        pVVar7 = p0->vObjs;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar7->nSize);
  }
  pVVar7 = p1->vObjs;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar12];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006ea388;
        uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar5 = Aig_And(p,pAVar5,pAVar9);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
        pVVar7 = p1->vObjs;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar7->nSize);
  }
  if (0 < p0->nTruePos) {
    lVar12 = 0;
    do {
      if (p0->vCos->nSize <= lVar12) goto LAB_006ea369;
      pvVar2 = p0->vCos->pArray[lVar12];
      if (Oper == 1) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006ea388;
        uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        if (p1->vCos->nSize <= lVar12) goto LAB_006ea369;
        pvVar2 = p1->vCos->pArray[lVar12];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006ea388;
        uVar6 = *(ulong *)((long)pvVar2 + 8);
        uVar8 = uVar6 & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar9 = (Aig_Obj_t *)0x1;
        }
        else {
          pAVar9 = (Aig_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar8 + 0x28) ^ 1);
        }
        pAVar5 = Aig_And(p,pAVar5,pAVar9);
      }
      else {
        if (Oper != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                        ,0x8a,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
        }
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006ea388;
        uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        if (p1->vCos->nSize <= lVar12) goto LAB_006ea369;
        pvVar2 = p1->vCos->pArray[lVar12];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006ea388;
        uVar6 = *(ulong *)((long)pvVar2 + 8);
        uVar8 = uVar6 & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        pAVar5 = Aig_Exor(p,pAVar5,pAVar9);
      }
      Aig_ObjCreateCo(p,pAVar5);
      lVar12 = lVar12 + 1;
    } while (lVar12 < p0->nTruePos);
  }
  iVar10 = p0->nRegs;
  if (0 < iVar10) {
    iVar11 = 0;
    do {
      uVar3 = p0->nTruePos + iVar11;
      if (((int)uVar3 < 0) || (p0->vCos->nSize <= (int)uVar3)) goto LAB_006ea369;
      pvVar2 = p0->vCos->pArray[uVar3];
      if (((ulong)pvVar2 & 1) != 0) goto LAB_006ea388;
      uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      pAVar5 = Aig_ObjCreateCo(p,pAVar5);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
      iVar11 = iVar11 + 1;
      iVar10 = p0->nRegs;
    } while (iVar11 < iVar10);
  }
  iVar11 = p1->nRegs;
  if (0 < iVar11) {
    iVar10 = 0;
    do {
      uVar3 = p1->nTruePos + iVar10;
      if (((int)uVar3 < 0) || (p1->vCos->nSize <= (int)uVar3)) {
LAB_006ea369:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p1->vCos->pArray[uVar3];
      if (((ulong)pvVar2 & 1) != 0) {
LAB_006ea388:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
      }
      pAVar5 = Aig_ObjCreateCo(p,pAVar5);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
      iVar10 = iVar10 + 1;
      iVar11 = p1->nRegs;
    } while (iVar10 < iVar11);
    iVar10 = p0->nRegs;
  }
  Aig_ManSetRegNum(p,iVar10 + iVar11);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCreateMiter( Aig_Man_t * p0, Aig_Man_t * p1, int Oper )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManRegNum(p0) > 0 || Saig_ManRegNum(p1) > 0 );
    assert( Saig_ManPiNum(p0) == Saig_ManPiNum(p1) );
    assert( Saig_ManPoNum(p0) == Saig_ManPoNum(p1) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p0) + Aig_ManObjNumMax(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    Aig_ManCleanData( p0 );
    Aig_ManCleanData( p1 );
    // map constant nodes
    Aig_ManConst1(p0)->pData = Aig_ManConst1(pNew);
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    // map primary inputs
    Saig_ManForEachPi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachPi( p1, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    // map register outputs
    Saig_ManForEachLo( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachLo( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // map internal nodes
    Aig_ManForEachNode( p0, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create primary outputs
    Saig_ManForEachPo( p0, pObj, i )
    {
        if ( Oper == 0 ) // XOR
            pObj = Aig_Exor( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild0Copy(Aig_ManCo(p1,i)) );
        else if ( Oper == 1 ) // implication is PO(p0) -> PO(p1)  ...  complement is PO(p0) & !PO(p1) 
            pObj = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_Not(Aig_ObjChild0Copy(Aig_ManCo(p1,i))) );
        else
            assert( 0 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    // create register inputs
    Saig_ManForEachLi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Saig_ManForEachLi( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // cleanup
    Aig_ManSetRegNum( pNew, Saig_ManRegNum(p0) + Saig_ManRegNum(p1) );
//    Aig_ManCleanup( pNew );
    return pNew;
}